

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O0

int __thiscall embree::LineCommentFilter::next(LineCommentFilter *this)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  char *pcVar4;
  Stream<int> *in_RDI;
  bool bVar5;
  Stream<int> *in_stack_00000018;
  size_t j;
  ulong uVar6;
  ulong n;
  Stream<int> *this_00;
  
  uVar6 = 0;
  this_00 = in_RDI;
  do {
    n = uVar6;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar6) {
      while( true ) {
        piVar3 = Stream<int>::peek(in_stack_00000018);
        bVar5 = false;
        if (*piVar3 != 10) {
          piVar3 = Stream<int>::peek(in_stack_00000018);
          bVar5 = *piVar3 != -1;
        }
        if (!bVar5) break;
        Stream<int>::get(in_stack_00000018);
      }
LAB_00172523:
      iVar1 = Stream<int>::get(in_stack_00000018);
      return iVar1;
    }
    piVar3 = Stream<int>::peek(in_stack_00000018);
    iVar1 = *piVar3;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&in_RDI[1].super_RefCount.refCounter);
    if (iVar1 != *pcVar4) {
      Stream<int>::unget(this_00,n);
      goto LAB_00172523;
    }
    Stream<int>::get(in_stack_00000018);
    uVar6 = n + 1;
  } while( true );
}

Assistant:

int next()
    {
      /* look if the line comment starts here */
      for (size_t j=0; j<lineComment.size(); j++) {
        if (cin->peek() != lineComment[j]) { cin->unget(j); goto not_found; }
        cin->get();
      }
      /* eat all characters until the end of the line (or file) */
      while (cin->peek() != '\n' && cin->peek() != EOF) cin->get();

    not_found:
      return cin->get();
    }